

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableDrawContextMenu(ImGuiTable *table)

{
  bool bVar1;
  ImGuiTableColumn *pIVar2;
  byte local_69;
  ImGuiTableColumn *local_68;
  int local_60;
  bool local_59;
  char *pcStack_58;
  bool menu_item_active;
  char *name;
  ImGuiTableColumn *other_column;
  char *pcStack_40;
  int other_column_n;
  char *size_all_desc;
  bool can_resize;
  ImGuiTableColumn *column;
  int column_n;
  bool want_separator;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTable *table_local;
  
  if ((GImGui->CurrentWindow->SkipItems & 1U) == 0) {
    bVar1 = false;
    if ((table->ContextPopupColumn < '\0') ||
       (table->ColumnsCount <= (int)table->ContextPopupColumn)) {
      local_60 = -1;
    }
    else {
      local_60 = (int)table->ContextPopupColumn;
    }
    if (local_60 == -1) {
      local_68 = (ImGuiTableColumn *)0x0;
    }
    else {
      local_68 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,local_60);
    }
    if ((table->Flags & 1U) != 0) {
      if (local_68 != (ImGuiTableColumn *)0x0) {
        local_69 = 0;
        if ((local_68->Flags & 0x10U) == 0) {
          local_69 = local_68->IsEnabled;
        }
        bVar1 = MenuItem("Size column to fit###SizeOne",(char *)0x0,false,(bool)(local_69 & 1));
        if (bVar1) {
          TableSetColumnWidthAutoSingle(table,local_60);
        }
      }
      if ((table->ColumnsEnabledFixedCount == table->ColumnsEnabledCount) &&
         ((table->Flags & 0xe000U) != 0x4000)) {
        pcStack_40 = "Size all columns to fit###SizeAll";
      }
      else {
        pcStack_40 = "Size all columns to default###SizeAll";
      }
      bVar1 = MenuItem(pcStack_40,(char *)0x0,false,true);
      if (bVar1) {
        TableSetColumnWidthAutoAll(table);
      }
      bVar1 = true;
    }
    if ((table->Flags & 2U) != 0) {
      bVar1 = MenuItem("Reset order",(char *)0x0,false,
                       (bool)((table->IsDefaultDisplayOrder ^ 0xffU) & 1));
      if (bVar1) {
        table->IsResetDisplayOrderRequest = true;
      }
      bVar1 = true;
    }
    if ((table->Flags & 4U) != 0) {
      if (bVar1) {
        Separator();
      }
      PushItemFlag(0x20,true);
      for (other_column._4_4_ = 0; other_column._4_4_ < table->ColumnsCount;
          other_column._4_4_ = other_column._4_4_ + 1) {
        pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,other_column._4_4_);
        pcStack_58 = TableGetColumnName(table,other_column._4_4_);
        if ((pcStack_58 == (char *)0x0) || (*pcStack_58 == '\0')) {
          pcStack_58 = "<Unknown>";
        }
        local_59 = (bool)(-((pIVar2->Flags & 0x40) == 0) & 1);
        if (((pIVar2->IsEnabled & 1U) != 0) && (table->ColumnsEnabledCount < '\x02')) {
          local_59 = false;
        }
        bVar1 = MenuItem(pcStack_58,(char *)0x0,(bool)(pIVar2->IsEnabled & 1),local_59);
        if (bVar1) {
          pIVar2->IsEnabledNextFrame = (bool)((pIVar2->IsEnabled ^ 0xffU) & 1);
        }
      }
      PopItemFlag();
    }
  }
  return;
}

Assistant:

void ImGui::TableDrawContextMenu(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    bool want_separator = false;
    const int column_n = (table->ContextPopupColumn >= 0 && table->ContextPopupColumn < table->ColumnsCount) ? table->ContextPopupColumn : -1;
    ImGuiTableColumn* column = (column_n != -1) ? &table->Columns[column_n] : NULL;

    // Sizing
    if (table->Flags & ImGuiTableFlags_Resizable)
    {
        if (column != NULL)
        {
            const bool can_resize = !(column->Flags & ImGuiTableColumnFlags_NoResize) && column->IsEnabled;
            if (MenuItem("Size column to fit###SizeOne", NULL, false, can_resize))
                TableSetColumnWidthAutoSingle(table, column_n);
        }

        const char* size_all_desc;
        if (table->ColumnsEnabledFixedCount == table->ColumnsEnabledCount && (table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame)
            size_all_desc = "Size all columns to fit###SizeAll";        // All fixed
        else
            size_all_desc = "Size all columns to default###SizeAll";    // All stretch or mixed
        if (MenuItem(size_all_desc, NULL))
            TableSetColumnWidthAutoAll(table);
        want_separator = true;
    }

    // Ordering
    if (table->Flags & ImGuiTableFlags_Reorderable)
    {
        if (MenuItem("Reset order", NULL, false, !table->IsDefaultDisplayOrder))
            table->IsResetDisplayOrderRequest = true;
        want_separator = true;
    }

    // Reset all (should work but seems unnecessary/noisy to expose?)
    //if (MenuItem("Reset all"))
    //    table->IsResetAllRequest = true;

    // Sorting
    // (modify TableOpenContextMenu() to add _Sortable flag if enabling this)
#if 0
    if ((table->Flags & ImGuiTableFlags_Sortable) && column != NULL && (column->Flags & ImGuiTableColumnFlags_NoSort) == 0)
    {
        if (want_separator)
            Separator();
        want_separator = true;

        bool append_to_sort_specs = g.IO.KeyShift;
        if (MenuItem("Sort in Ascending Order", NULL, column->SortOrder != -1 && column->SortDirection == ImGuiSortDirection_Ascending, (column->Flags & ImGuiTableColumnFlags_NoSortAscending) == 0))
            TableSetColumnSortDirection(table, column_n, ImGuiSortDirection_Ascending, append_to_sort_specs);
        if (MenuItem("Sort in Descending Order", NULL, column->SortOrder != -1 && column->SortDirection == ImGuiSortDirection_Descending, (column->Flags & ImGuiTableColumnFlags_NoSortDescending) == 0))
            TableSetColumnSortDirection(table, column_n, ImGuiSortDirection_Descending, append_to_sort_specs);
    }
#endif

    // Hiding / Visibility
    if (table->Flags & ImGuiTableFlags_Hideable)
    {
        if (want_separator)
            Separator();
        want_separator = true;

        PushItemFlag(ImGuiItemFlags_SelectableDontClosePopup, true);
        for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
        {
            ImGuiTableColumn* other_column = &table->Columns[other_column_n];
            const char* name = TableGetColumnName(table, other_column_n);
            if (name == NULL || name[0] == 0)
                name = "<Unknown>";

            // Make sure we can't hide the last active column
            bool menu_item_active = (other_column->Flags & ImGuiTableColumnFlags_NoHide) ? false : true;
            if (other_column->IsEnabled && table->ColumnsEnabledCount <= 1)
                menu_item_active = false;
            if (MenuItem(name, NULL, other_column->IsEnabled, menu_item_active))
                other_column->IsEnabledNextFrame = !other_column->IsEnabled;
        }
        PopItemFlag();
    }
}